

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O0

int patchtestreg(FuncState *fs,int node,int reg)

{
  Instruction *pIVar1;
  Instruction *i;
  int reg_local;
  int node_local;
  FuncState *fs_local;
  
  pIVar1 = getjumpcontrol(fs,node);
  if ((*pIVar1 & 0xff) == 0x23) {
    if ((reg == 0x7f) || (reg == *pIVar1 >> 0x18)) {
      *pIVar1 = (*pIVar1 >> 0x18) << 8 | 0x22 | (*pIVar1 >> 0x10 & 0xff) << 0x10;
      if ((ravi_parser_debug & 2U) != 0) {
        raviY_printf(fs,"[?]* %o ; generate OP_TEST\n",(ulong)*pIVar1);
      }
    }
    else {
      *(byte *)((long)pIVar1 + 1) = (byte)reg & 0x7f;
      if ((ravi_parser_debug & 2U) != 0) {
        raviY_printf(fs,"[?]* %o ; set A to %d\n",(ulong)*pIVar1,(ulong)(uint)reg);
      }
    }
    fs_local._4_4_ = 1;
  }
  else {
    fs_local._4_4_ = 0;
  }
  return fs_local._4_4_;
}

Assistant:

static int patchtestreg (FuncState *fs, int node, int reg) {
  Instruction *i = getjumpcontrol(fs, node);
  if (GET_OPCODE(*i) != OP_TESTSET)
    return 0;  /* cannot patch other instructions */
  if (reg != NO_REG && reg != GETARG_B(*i)) {
    SETARG_A(*i, reg);
    DEBUG_CODEGEN(raviY_printf(fs, "[?]* %o ; set A to %d\n", *i, reg));
  }
  else {
     /* no register to put value or register already has the value;
        change instruction to simple test */
    *i = CREATE_ABC(OP_TEST, GETARG_B(*i), 0, GETARG_C(*i));
    DEBUG_CODEGEN(raviY_printf(fs, "[?]* %o ; generate OP_TEST\n", *i));
  }
  return 1;
}